

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testInvert.cpp
# Opt level: O1

void anon_unknown.dwarf_6a4c7::invertM44f(M44f *m,float e)

{
  bool bVar1;
  M44f ident2;
  M44f ident1;
  M44f inv2;
  M44f inv1;
  Matrix44<float> local_128;
  Matrix44<float> local_e8;
  Matrix44<float> local_a0;
  Matrix44<float> local_60;
  
  Imath_2_5::Matrix44<float>::inverse(&local_60,m,false);
  Imath_2_5::Matrix44<float>::gjInverse(&local_a0,m,false);
  local_e8.x[3][0] = 0.0;
  local_e8.x[3][1] = 0.0;
  local_e8.x[3][2] = 0.0;
  local_e8.x[3][3] = 0.0;
  local_e8.x[2][0] = 0.0;
  local_e8.x[2][1] = 0.0;
  local_e8.x[2][2] = 0.0;
  local_e8.x[2][3] = 0.0;
  local_e8.x[1][0] = 0.0;
  local_e8.x[1][1] = 0.0;
  local_e8.x[1][2] = 0.0;
  local_e8.x[1][3] = 0.0;
  local_e8.x[0][0] = 0.0;
  local_e8.x[0][1] = 0.0;
  local_e8.x[0][2] = 0.0;
  local_e8.x[0][3] = 0.0;
  Imath_2_5::Matrix44<float>::multiply(m,&local_60,&local_e8);
  local_128.x[3][0] = 0.0;
  local_128.x[3][1] = 0.0;
  local_128.x[3][2] = 0.0;
  local_128.x[3][3] = 0.0;
  local_128.x[2][0] = 0.0;
  local_128.x[2][1] = 0.0;
  local_128.x[2][2] = 0.0;
  local_128.x[2][3] = 0.0;
  local_128.x[1][0] = 0.0;
  local_128.x[1][1] = 0.0;
  local_128.x[1][2] = 0.0;
  local_128.x[1][3] = 0.0;
  local_128.x[0][0] = 0.0;
  local_128.x[0][1] = 0.0;
  local_128.x[0][2] = 0.0;
  local_128.x[0][3] = 0.0;
  Imath_2_5::Matrix44<float>::multiply(m,&local_a0,&local_128);
  bVar1 = Imath_2_5::Matrix44<float>::equalWithAbsError
                    (&local_e8,(Matrix44<float> *)&Imath_2_5::identity44f,e);
  if (!bVar1) {
    __assert_fail("ident1.equalWithAbsError (identity44f, e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testInvert.cpp"
                  ,0x3f,"void (anonymous namespace)::invertM44f(const M44f &, float)");
  }
  bVar1 = Imath_2_5::Matrix44<float>::equalWithAbsError
                    (&local_128,(Matrix44<float> *)&Imath_2_5::identity44f,e);
  if (bVar1) {
    return;
  }
  __assert_fail("ident2.equalWithAbsError (identity44f, e)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testInvert.cpp"
                ,0x40,"void (anonymous namespace)::invertM44f(const M44f &, float)");
}

Assistant:

void
invertM44f (const M44f &m, float e)
{
    M44f inv1 = m.inverse();
    M44f inv2 = m.gjInverse();
    M44f ident1 = m * inv1;
    M44f ident2 = m * inv2;

    //cout << "m\n" << m << endl;
    //cout << "inv1\n" << inv1 << "ident1\n" << ident1 << endl;
    //cout << "inv2\n" << inv2 << "ident2\n" << ident2 << endl;

    assert (ident1.equalWithAbsError (identity44f, e));
    assert (ident2.equalWithAbsError (identity44f, e));
}